

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_avx2.c
# Opt level: O3

void randomx_argon2_fill_segment_avx2(argon2_instance_t *instance,argon2_position_t position)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  __m256i state [32];
  argon2_position_t local_470;
  longlong local_460 [134];
  
  local_470._8_8_ = position._8_8_;
  local_470._0_8_ = position._0_8_;
  if (instance != (argon2_instance_t *)0x0) {
    bVar12 = ((undefined1  [16])position & (undefined1  [16])0xff) == (undefined1  [16])0x0 &&
             ((undefined1  [16])position & (undefined1  [16])0xffffffff) == (undefined1  [16])0x0;
    uVar6 = instance->segment_length;
    uVar1 = instance->lane_length;
    iVar10 = position.lane * uVar1;
    iVar3 = position.slice * uVar6;
    uVar9 = (uint)bVar12 * 2;
    uVar5 = iVar10 + (uint)bVar12 * 2 + iVar3;
    uVar7 = (ulong)((-(uint)(uVar5 % uVar1 != 0) | uVar1 - 1) + uVar5);
    memcpy(local_460,instance->memory + uVar7,0x400);
    if (uVar9 < uVar6) {
      iVar3 = iVar3 + iVar10;
      do {
        uVar6 = iVar3 + uVar9;
        uVar11 = (ulong)(iVar3 + -1 + uVar9);
        if (uVar6 % instance->lane_length != 1) {
          uVar11 = uVar7;
        }
        uVar7 = instance->memory[uVar11].v[0];
        uVar2 = (uVar7 >> 0x20) % (ulong)instance->lanes;
        uVar8 = uVar2;
        if (local_470.slice == '\0') {
          uVar8 = (ulong)local_470._0_8_ >> 0x20;
        }
        if (local_470.pass != 0) {
          uVar8 = uVar2;
        }
        local_470.index = uVar9;
        uVar4 = randomx_argon2_index_alpha
                          (instance,&local_470,(uint32_t)uVar7,
                           (uint)(uVar8 == (ulong)local_470._0_8_ >> 0x20));
        fill_block((__m256i *)local_460,
                   instance->memory + instance->lane_length * uVar8 + (ulong)uVar4,
                   instance->memory + uVar6,(uint)(local_470.pass != 0 && instance->version != 0x10)
                  );
        uVar9 = uVar9 + 1;
        uVar7 = (ulong)((int)uVar11 + 1);
      } while (uVar9 < instance->segment_length);
    }
  }
  return;
}

Assistant:

void randomx_argon2_fill_segment_avx2(const argon2_instance_t* instance,
	argon2_position_t position) {
	block* ref_block = NULL, * curr_block = NULL;
	block address_block, input_block;
	uint64_t pseudo_rand, ref_index, ref_lane;
	uint32_t prev_offset, curr_offset;
	uint32_t starting_index, i;
	__m256i state[ARGON2_HWORDS_IN_BLOCK];

	if (instance == NULL) {
		return;
	}

	starting_index = 0;

	if ((0 == position.pass) && (0 == position.slice)) {
		starting_index = 2; /* we have already generated the first two blocks */
	}

	/* Offset of the current block */
	curr_offset = position.lane * instance->lane_length +
		position.slice * instance->segment_length + starting_index;

	if (0 == curr_offset % instance->lane_length) {
		/* Last block in this lane */
		prev_offset = curr_offset + instance->lane_length - 1;
	}
	else {
		/* Previous block */
		prev_offset = curr_offset - 1;
	}

	memcpy(state, ((instance->memory + prev_offset)->v), ARGON2_BLOCK_SIZE);

	for (i = starting_index; i < instance->segment_length;
		++i, ++curr_offset, ++prev_offset) {
		/*1.1 Rotating prev_offset if needed */
		if (curr_offset % instance->lane_length == 1) {
			prev_offset = curr_offset - 1;
		}

		/* 1.2 Computing the index of the reference block */
		/* 1.2.1 Taking pseudo-random value from the previous block */
		pseudo_rand = instance->memory[prev_offset].v[0];

		/* 1.2.2 Computing the lane of the reference block */
		ref_lane = ((pseudo_rand >> 32)) % instance->lanes;

		if ((position.pass == 0) && (position.slice == 0)) {
			/* Can not reference other lanes yet */
			ref_lane = position.lane;
		}

		/* 1.2.3 Computing the number of possible reference block within the
		 * lane.
		 */
		position.index = i;
		ref_index = randomx_argon2_index_alpha(instance, &position, pseudo_rand & 0xFFFFFFFF,
			ref_lane == position.lane);

		/* 2 Creating a new block */
		ref_block =
			instance->memory + instance->lane_length * ref_lane + ref_index;
		curr_block = instance->memory + curr_offset;
		if (ARGON2_VERSION_10 == instance->version) {
			/* version 1.2.1 and earlier: overwrite, not XOR */
			fill_block(state, ref_block, curr_block, 0);
		}
		else {
			if (0 == position.pass) {
				fill_block(state, ref_block, curr_block, 0);
			}
			else {
				fill_block(state, ref_block, curr_block, 1);
			}
		}
	}
}